

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::HeapType> *
wasm::WATParser::typeuse<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::HeapType> *__return_storage_ptr__,ParseDefsCtx *ctx,bool allowNames)

{
  Lexer *this;
  undefined1 *puVar1;
  undefined8 *puVar2;
  optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  bool bVar3;
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  *p_Var4;
  __index_type *params;
  undefined1 uVar5;
  __index_type *__rhs;
  string_view expected;
  uintptr_t local_118;
  undefined8 uStack_110;
  undefined7 uStack_f7;
  undefined1 auStack_f0 [8];
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> namedParams;
  long local_b8;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  size_t local_88;
  undefined1 local_80 [8];
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> _val_2;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> resultTypes;
  
  this = &ctx->in;
  local_88 = (ctx->in).pos;
  expected._M_str = "type";
  expected._M_len = 4;
  bVar3 = Lexer::takeSExprStart(this,expected);
  if (bVar3) {
    typeidx<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
               auStack_f0,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)((long)&_val_2.val.
                                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                         + 0x20),
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)auStack_f0);
    if (resultTypes.val.
        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_ ==
        '\x01') {
      puVar1 = (undefined1 *)
               ((long)&_val_2.val.
                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 8);
      local_80 = (undefined1  [8])puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,
                 _val_2.val.
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_
                 ,resultTypes.val.
                  super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
                  _0_8_ + _val_2.val.
                          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                          ._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err> = puVar2;
      if (local_80 == (undefined1  [8])puVar1) {
        *puVar2 = CONCAT71(_val_2.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           ._M_u._9_7_,
                           _val_2.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x18) =
             _val_2.val.
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
             _16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err> = local_80;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::HeapType,_wasm::Err>.
                          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                          super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x10) =
             CONCAT71(_val_2.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      _M_u._9_7_,
                      _val_2.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      _M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 8) =
           _val_2.val.
           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._0_8_;
      _val_2.val.
      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
      _val_2.val.
      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._M_first.
      _M_storage._M_storage[8] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x20) = '\x01';
      local_80 = (undefined1  [8])puVar1;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
      bVar3 = Lexer::takeRParen(this);
      if (bVar3) {
        p_Var4 = (_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                  *)0x0;
        if (namedParams.val.
            super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._M_u.
            _24_1_ == '\0') {
          p_Var4 = (_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                    *)auStack_f0;
        }
        local_118 = (p_Var4->_M_u)._M_first._M_storage.type.id;
        uStack_110 = *(undefined8 *)&(p_Var4->_M_u)._M_first._M_storage.exactness;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                             *)auStack_f0);
        uVar5 = 1;
        goto LAB_00c1775c;
      }
      namedParams.val.
      super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._32_8_ =
           &stack0xffffffffffffff48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 ((long)&namedParams.val.
                         super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                 + 0x20),"expected end of type use","");
      Lexer::err((Err *)((long)&_val_2.val.
                                super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                .
                                super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                        + 0x20),this,
                 (string *)
                 ((long)&namedParams.val.
                         super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                 + 0x20));
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err> = puVar2;
      puVar1 = (undefined1 *)
               ((long)&resultTypes.val.
                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 8);
      if ((undefined1 *)
          _val_2.val.
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_ ==
          puVar1) {
        *puVar2 = CONCAT71(resultTypes.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           ._M_u._9_7_,
                           resultTypes.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x18) =
             resultTypes.val.
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
             _16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err> =
             _val_2.val.
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::HeapType,_wasm::Err>.
                          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                          super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x10) =
             CONCAT71(resultTypes.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      _M_u._9_7_,
                      resultTypes.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      _M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 8) =
           resultTypes.val.
           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._0_8_;
      resultTypes.val.
      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
      resultTypes.val.
      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._M_first.
      _M_storage._M_storage[8] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x20) = '\x01';
      _val_2.val.
      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_ = puVar1;
      if ((long *)namedParams.val.
                  super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                  _32_8_ != &stack0xffffffffffffff48) {
        operator_delete((void *)namedParams.val.
                                super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                                .
                                super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                .
                                super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                ._32_8_,local_b8 + 1);
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)auStack_f0);
  }
  else {
    uVar5 = 0;
LAB_00c1775c:
    params<wasm::WATParser::ParseDefsCtx>
              ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               auStack_f0,ctx,allowNames);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)((long)&_val_2.val.
                                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                         + 0x20),
                      (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)auStack_f0);
    if (resultTypes.val.
        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_ ==
        '\x02') {
      puVar1 = (undefined1 *)
               ((long)&_val_2.val.
                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 8);
      local_80 = (undefined1  [8])puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,
                 _val_2.val.
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_
                 ,resultTypes.val.
                  super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
                  _0_8_ + _val_2.val.
                          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                          ._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err> = puVar2;
      if (local_80 == (undefined1  [8])puVar1) {
        *puVar2 = CONCAT71(_val_2.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           ._M_u._9_7_,
                           _val_2.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x18) =
             _val_2.val.
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
             _16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err> = local_80;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::HeapType,_wasm::Err>.
                          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                          super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x10) =
             CONCAT71(_val_2.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      _M_u._9_7_,
                      _val_2.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      _M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 8) =
           _val_2.val.
           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._0_8_;
      _val_2.val.
      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
      _val_2.val.
      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._M_first.
      _M_storage._M_storage[8] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x20) = '\x01';
      local_80 = (undefined1  [8])puVar1;
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
      results<wasm::WATParser::ParseDefsCtx>
                ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20),ctx);
      __rhs = (__index_type *)
              ((long)&_val_2.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20)
      ;
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)local_80,
                        (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)__rhs);
      if (_val_2.val.
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_
          == '\x02') {
        local_a8 = &local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_80,
                   (undefined1 *)
                   (_val_2.val.
                    super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                    .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                    _M_u._0_8_ + (long)local_80));
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::HeapType,_wasm::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err> = puVar2;
        if (local_a8 == &local_98) {
          *puVar2 = CONCAT71(uStack_97,local_98);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x18) = uStack_90;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
            super__Variant_storage_alias<wasm::HeapType,_wasm::Err> = local_a8;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x10) =
               CONCAT71(uStack_97,local_98);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 8) = local_a0;
        local_a0 = 0;
        local_98 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x20) = '\x01';
        local_a8 = &local_98;
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             *)local_80);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             *)local_80);
        params = auStack_f0;
        if (namedParams.val.
            super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._M_u.
            _24_1_ != '\0') {
          params = (__index_type *)0x0;
        }
        if (resultTypes.val.
            super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_
            != '\0') {
          __rhs = (__index_type *)0x0;
        }
        type.
        super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
        ._17_7_ = uStack_f7;
        type.
        super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
        ._M_engaged = (bool)uVar5;
        type.
        super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
        ._M_payload._8_8_ = uStack_110;
        type.
        super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
        ._M_payload._M_value.type.id = (HeapType)(HeapType)local_118;
        ParseDefsCtx::makeTypeUse
                  (__return_storage_ptr__,ctx,(Index)local_88,type,(ParamsT *)params,
                   (ResultsT *)__rhs);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                         *)auStack_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeUseT> typeuse(Ctx& ctx, bool allowNames) {
  auto pos = ctx.in.getPos();
  std::optional<typename Ctx::HeapTypeT> type;
  if (ctx.in.takeSExprStart("type"sv)) {
    auto x = typeidx(ctx);
    CHECK_ERR(x);

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of type use");
    }

    type = *x;
  }

  auto namedParams = params(ctx, allowNames);
  CHECK_ERR(namedParams);

  auto resultTypes = results(ctx);
  CHECK_ERR(resultTypes);

  return ctx.makeTypeUse(pos, type, namedParams.getPtr(), resultTypes.getPtr());
}